

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::ParseMachOHeader<bloaty::macho::AddMachOFallback(bloaty::RangeSink*)::__0>
               (string_view macho_file,RangeSink *overhead_sink,
               anon_class_8_1_89918b91 *loadcmd_func)

{
  char *pcVar1;
  int *piVar2;
  ulong uVar3;
  char *in_R8;
  RangeSink *pRVar4;
  uint64_t end;
  char *pcVar5;
  int iVar6;
  string_view command_data;
  string_view command_data_00;
  string_view command_data_01;
  string_view command_data_02;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  
  piVar2 = (int *)macho_file._M_str;
  uVar3 = macho_file._M_len;
  if (uVar3 < 4) {
    Throw("Malformed Mach-O file",0x2c);
  }
  iVar6 = *piVar2;
  if (iVar6 < -0x1120531) {
    if (iVar6 != -0x1120532) {
      if ((iVar6 == -0x31051202) || (iVar6 == -0x30051202)) {
        Throw("We don\'t support cross-endian Mach-O files.",0x97);
      }
LAB_0019874f:
      Throw("Corrupt Mach-O file",0x99);
    }
    if (uVar3 < 0x1c) {
LAB_001986d4:
      Throw("Premature EOF reading Mach-O data.",0x36);
    }
    data._M_str = in_R8;
    data._M_len = (size_t)piVar2;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x1c,data);
    iVar6 = piVar2[4];
    if (iVar6 != 0) {
      piVar2 = piVar2 + 7;
      pcVar5 = (char *)(uVar3 - 0x1c);
      do {
        if (pcVar5 < (char *)0x8) goto LAB_001986d4;
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar1 == (char *)0x0) {
LAB_001986e5:
          Throw("Mach-O load command had zero size.",0x66);
        }
        if (pcVar5 < pcVar1) {
LAB_001986f6:
          Throw("region out-of-bounds",0x5d);
        }
        pRVar4 = loadcmd_func->sink;
        if (*piVar2 == 1) {
          command_data_00._M_str = (char *)piVar2;
          command_data_00._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command,section>(command_data_00,macho_file,pRVar4);
        }
        else if (*piVar2 == 0x19) {
          command_data._M_str = (char *)piVar2;
          command_data._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command_64,section_64>(command_data,macho_file,pRVar4);
        }
        data_00._M_str = (char *)pRVar4;
        data_00._M_len = (size_t)piVar2;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",pcVar1,data_00);
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar5 < pcVar1) {
LAB_00198707:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar1,pcVar5);
        }
        piVar2 = (int *)((long)piVar2 + (long)pcVar1);
        iVar6 = iVar6 + -1;
        pcVar5 = pcVar5 + -(long)pcVar1;
      } while (iVar6 != 0);
    }
  }
  else {
    if (iVar6 != -0x1120531) goto LAB_0019874f;
    if (uVar3 < 0x20) goto LAB_001986d4;
    data_01._M_str = in_R8;
    data_01._M_len = (size_t)piVar2;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x20,data_01);
    iVar6 = piVar2[4];
    if (iVar6 != 0) {
      piVar2 = piVar2 + 8;
      pcVar5 = (char *)(uVar3 - 0x20);
      do {
        if (pcVar5 < (char *)0x8) goto LAB_001986d4;
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar1 == (char *)0x0) goto LAB_001986e5;
        if (pcVar5 < pcVar1) goto LAB_001986f6;
        pRVar4 = loadcmd_func->sink;
        if (*piVar2 == 1) {
          command_data_02._M_str = (char *)piVar2;
          command_data_02._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command,section>(command_data_02,macho_file,pRVar4);
        }
        else if (*piVar2 == 0x19) {
          command_data_01._M_str = (char *)piVar2;
          command_data_01._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command_64,section_64>(command_data_01,macho_file,pRVar4);
        }
        data_02._M_str = (char *)pRVar4;
        data_02._M_len = (size_t)piVar2;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",pcVar1,data_02);
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar5 < pcVar1) goto LAB_00198707;
        piVar2 = (int *)((long)piVar2 + (long)pcVar1);
        iVar6 = iVar6 + -1;
        pcVar5 = pcVar5 + -(long)pcVar1;
      } while (iVar6 != 0);
    }
  }
  return;
}

Assistant:

void ParseMachOHeader(string_view macho_file, RangeSink* overhead_sink,
                      Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(macho_file);
  switch (magic) {
    case MH_MAGIC:
      // We don't expect to see many 32-bit binaries out in the wild.
      // Apple is aggressively phasing out support for 32-bit binaries:
      //   https://www.macrumors.com/2017/06/06/apple-to-phase-out-32-bit-mac-apps/
      //
      // Still, you can build 32-bit binaries as of this writing, and
      // there are existing 32-bit binaries floating around, so we might
      // as well support them.
      ParseMachOHeaderImpl<mach_header>(macho_file, overhead_sink,
                                        std::forward<Func>(loadcmd_func));
      break;
    case MH_MAGIC_64:
      ParseMachOHeaderImpl<mach_header_64>(
          macho_file, overhead_sink, std::forward<Func>(loadcmd_func));
      break;
    case MH_CIGAM:
    case MH_CIGAM_64:
      // OS X and Darwin currently only run on x86/x86-64 (little-endian
      // platforms), so we expect basically all Mach-O files to be
      // little-endian.  Additionally, pretty much all CPU architectures
      // are little-endian these days.  ARM has the option to be
      // big-endian, but I can't find any OS that is actually compiled to
      // use big-endian mode.  debian-mips is the only big-endian OS I can
      // find (and maybe SPARC).
      //
      // All of this is to say, this case should only happen if you are
      // running Bloaty on debian-mips.  I consider that uncommon enough
      // (and hard enough to test) that we don't support this until there
      // is a demonstrated need.
      THROW("We don't support cross-endian Mach-O files.");
    default:
      THROW("Corrupt Mach-O file");
  }
}